

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textlabel.cpp
# Opt level: O2

void __thiscall QtMWidgets::TextLabel::paintEvent(TextLabel *this,QPaintEvent *e)

{
  int iVar1;
  QRect QVar2;
  int iVar3;
  TextLabelPrivate *pTVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  double in_XMM1_Qa;
  QPainter p;
  QPoint topLeft;
  QRect cr;
  
  QFrame::paintEvent((QPaintEvent *)this);
  QPainter::QPainter(&p,(QPaintDevice *)&this->field_0x10);
  cr = (QRect)QWidget::contentsRect();
  QPainter::setClipRect(&p,&cr,1);
  QPainter::setPen((QColor *)&p);
  QStaticText::textOption();
  uVar5 = topLeft.xp & 0x1e0;
  QTextOption::~QTextOption((QTextOption *)&topLeft);
  QVar2 = cr;
  topLeft.xp = cr.x1;
  topLeft.yp = cr.y1;
  pTVar4 = (this->d).d;
  iVar1 = pTVar4->margin;
  iVar7 = QVar2.x1;
  cr.y2 = QVar2.y2;
  iVar3 = cr.y2;
  cr = QVar2;
  if (uVar5 == 0x40) {
    QStaticText::size();
    topLeft.xp = iVar1 + iVar7;
    pTVar4 = (this->d).d;
    topLeft.yp = iVar3 - ((int)((double)((ulong)in_XMM1_Qa & 0x8000000000000000 |
                                        (ulong)DAT_00187140) + in_XMM1_Qa) + pTVar4->margin);
  }
  else {
    iVar6 = QVar2.y1;
    if (uVar5 == 0x80) {
      QStaticText::size();
      topLeft.xp = iVar1 + iVar7;
      topLeft.yp = (int)((double)((ulong)in_XMM1_Qa & 0x8000000000000000 | (ulong)DAT_00187140) +
                        in_XMM1_Qa) / -2 + ((iVar3 - iVar6) + 1) / 2 + iVar6;
      pTVar4 = (this->d).d;
    }
    else if (iVar1 != 0) {
      topLeft.yp = iVar6 + iVar1;
      topLeft.xp = iVar1 + iVar7;
    }
  }
  QPainter::drawStaticText(&p,&topLeft,&pTVar4->staticText);
  QPainter::~QPainter(&p);
  return;
}

Assistant:

void
TextLabel::paintEvent( QPaintEvent * e )
{
	QFrame::paintEvent( e );

	QPainter p( this );
	const QRect cr = contentsRect();

	p.setClipRect( cr );
	p.setPen( d->color );

	int vAlign = d->staticText.textOption().alignment() & Qt::AlignVertical_Mask;

	QPoint topLeft = cr.topLeft();

	switch( vAlign )
	{
		case Qt::AlignBottom :
			topLeft = QPoint( topLeft.x() + d->margin,
				cr.bottomLeft().y() - qRound( d->staticText.size().height() ) -
				d->margin );
		break;

		case Qt::AlignVCenter :
			topLeft = QPoint( topLeft.x() + d->margin,
				topLeft.y() + cr.height() / 2 -
					qRound( d->staticText.size().height() ) / 2 );
		break;

		default :
		{
			if( d->margin != 0 )
				topLeft += QPoint( d->margin, d->margin );
		}
		break;
	}

	p.drawStaticText( topLeft, d->staticText );
}